

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::ReconstructTileOffsets
               (OffsetData *offset_data,EXRHeader *exr_header,uchar *head,uchar *marker,
               size_t param_5,bool isMultiPartFile,bool isDeep)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  pointer pvVar10;
  ulong uVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  pointer pvVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pvVar20;
  bool bVar21;
  bool bVar22;
  
  if ((offset_data->offsets).
      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (offset_data->offsets).
      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar1 = offset_data->num_x_levels;
    uVar19 = (ulong)(((uint)param_5 & 0xff) << 2);
    uVar13 = 0;
    do {
      pvVar20 = (offset_data->offsets).
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar21 = *(pointer *)
                ((long)&pvVar20[uVar13].
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl + 8) !=
               *(pointer *)
                &pvVar20[uVar13].
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl;
      if (bVar21) {
        uVar11 = 0;
        do {
          pvVar20 = (offset_data->offsets).
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar10 = pvVar20[uVar13].
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar22 = *(pointer *)
                    ((long)&pvVar10[uVar11].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8) !=
                   pvVar10[uVar11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar22) {
            puVar12 = marker;
            uVar15 = 1;
            while( true ) {
              if (isMultiPartFile) {
                lVar8 = *(long *)(puVar12 + uVar19 + 0x18) +
                        *(long *)(puVar12 + uVar19 + 0x10) + uVar19 + 0x28;
              }
              else {
                lVar8 = (long)*(int *)(puVar12 + uVar19 + 0x10) + uVar19 + 0x14;
              }
              marker = puVar12 + lVar8;
              uVar2 = *(uint *)(puVar12 + uVar19);
              uVar3 = *(uint *)(puVar12 + uVar19 + 4);
              uVar14 = (ulong)uVar3;
              uVar4 = *(uint *)(puVar12 + uVar19 + 8);
              uVar18 = (ulong)uVar4;
              uVar16 = *(uint *)(puVar12 + uVar19 + 0xc);
              if ((int)(uVar2 | uVar3 | uVar16 | uVar4) < 0) break;
              iVar5 = offset_data->num_x_levels;
              iVar6 = exr_header->tile_level_mode;
              if (iVar6 == 2) {
                if (((iVar5 <= (int)uVar4) || (offset_data->num_y_levels <= (int)uVar16)) ||
                   (uVar18 = (long)iVar5 * (ulong)uVar16 + uVar18,
                   uVar9 = ((long)(offset_data->offsets).
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20 >> 3) *
                           -0x5555555555555555, uVar9 < uVar18 || uVar9 - uVar18 == 0)) break;
LAB_0019feb1:
                pvVar10 = pvVar20[uVar18].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pvVar17 = pvVar20[uVar18].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                if (iVar6 == 1) {
                  if ((((int)uVar4 < iVar5) && ((int)uVar16 < offset_data->num_y_levels)) &&
                     (uVar9 = ((long)(offset_data->offsets).
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar20 >> 3
                              ) * -0x5555555555555555, uVar18 <= uVar9 && uVar9 - uVar18 != 0))
                  goto LAB_0019feb1;
                  break;
                }
                if (((iVar6 != 0) || ((uVar16 | uVar4) != 0)) ||
                   ((offset_data->offsets).
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == pvVar20)) break;
                pvVar10 = (pvVar20->
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pvVar17 = (pvVar20->
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              }
              uVar18 = ((long)pvVar17 - (long)pvVar10 >> 3) * -0x5555555555555555;
              if ((uVar18 < uVar14 || uVar18 - uVar14 == 0) ||
                 ((ulong)((long)*(pointer *)
                                 ((long)&pvVar10[uVar14].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                          *(long *)&pvVar10[uVar14].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data >> 3) <= (ulong)uVar2)) break;
              if (exr_header->tile_level_mode == 2) {
                uVar16 = uVar16 * iVar1 + uVar4;
              }
              else {
                uVar16 = 0;
                if (exr_header->tile_level_mode == 1) {
                  uVar16 = uVar4;
                }
              }
              *(long *)(*(long *)&pvVar20[(int)uVar16].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + (long)(int)uVar2 * 8) =
                   (long)puVar12 - (long)head;
              pvVar20 = (offset_data->offsets).
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar10 = pvVar20[uVar13].
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar18 = (long)*(pointer *)
                              ((long)&pvVar10[uVar11].
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar10[uVar11].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data >> 3;
              bVar22 = uVar15 < uVar18;
              bVar7 = uVar18 <= uVar15;
              puVar12 = marker;
              uVar15 = (ulong)((int)uVar15 + 1);
              if (bVar7) break;
            }
          }
          if (bVar22) break;
          uVar11 = (ulong)((int)uVar11 + 1);
          pvVar20 = (offset_data->offsets).
                    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar15 = ((long)*(pointer *)
                           ((long)&pvVar20[uVar13].
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl + 8) -
                    *(long *)&pvVar20[uVar13].
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl >> 3) * -0x5555555555555555;
          bVar22 = uVar15 - uVar11 != 0;
          bVar21 = uVar11 <= uVar15 && bVar22;
        } while (uVar11 <= uVar15 && bVar22);
      }
    } while ((!bVar21) &&
            (uVar13 = (ulong)((int)uVar13 + 1),
            uVar11 = ((long)(offset_data->offsets).
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(offset_data->offsets).
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
            uVar13 <= uVar11 && uVar11 - uVar13 != 0));
  }
  return;
}

Assistant:

static void ReconstructTileOffsets(OffsetData& offset_data,
                                   const EXRHeader* exr_header,
                                   const unsigned char* head, const unsigned char* marker, const size_t /*size*/,
                                   bool isMultiPartFile,
                                   bool isDeep) {
  int numXLevels = offset_data.num_x_levels;
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
        tinyexr::tinyexr_uint64 tileOffset = tinyexr::tinyexr_uint64(marker - head);

        if (isMultiPartFile) {
          //int partNumber;
          marker += sizeof(int);
        }

        int tileX;
        memcpy(&tileX, marker, sizeof(int));
        tinyexr::swap4(&tileX);
        marker += sizeof(int);

        int tileY;
        memcpy(&tileY, marker, sizeof(int));
        tinyexr::swap4(&tileY);
        marker += sizeof(int);

        int levelX;
        memcpy(&levelX, marker, sizeof(int));
        tinyexr::swap4(&levelX);
        marker += sizeof(int);

        int levelY;
        memcpy(&levelY, marker, sizeof(int));
        tinyexr::swap4(&levelY);
        marker += sizeof(int);

        if (isDeep) {
          tinyexr::tinyexr_int64 packed_offset_table_size;
          memcpy(&packed_offset_table_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_offset_table_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          tinyexr::tinyexr_int64 packed_sample_size;
          memcpy(&packed_sample_size, marker, sizeof(tinyexr::tinyexr_int64));
          tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64*>(&packed_sample_size));
          marker += sizeof(tinyexr::tinyexr_int64);

          // next Int64 is unpacked sample size - skip that too
          marker += packed_offset_table_size + packed_sample_size + 8;

        } else {

          int dataSize;
          memcpy(&dataSize, marker, sizeof(int));
          tinyexr::swap4(&dataSize);
          marker += sizeof(int);
          marker += dataSize;
        }

        if (!isValidTile(exr_header, offset_data,
          tileX, tileY, levelX, levelY))
          return;

        int level_idx = LevelIndex(levelX, levelY, exr_header->tile_level_mode, numXLevels);
        offset_data.offsets[size_t(level_idx)][size_t(tileY)][size_t(tileX)] = tileOffset;
      }
    }
  }
}